

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

void __thiscall
libtorrent::session::start(session *this,session_flags_t flags,settings_pack *sp,io_service *ios)

{
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  vStack_148;
  session_params local_130;
  
  anon_unknown_91::default_plugins(&vStack_148,(flags.m_val & 1) == 0);
  session_params::session_params(&local_130,sp,&vStack_148);
  start(this,&local_130,ios);
  session_params::~session_params(&local_130);
  std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::~vector(&vStack_148);
  return;
}

Assistant:

void session::start(session_flags_t const flags, settings_pack&& sp, io_service* ios)
	{
		start({std::move(sp),
			default_plugins(!(flags & add_default_plugins))}, ios);
	}